

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

RESULT_TYPE __thiscall
duckdb::Interpolator<true>::InterpolateInternal<signed_char,duckdb::QuantileDirect<signed_char>>
          (Interpolator<true> *this,char *v_t,QuantileDirect<signed_char> *accessor)

{
  idx_t iVar1;
  long lVar2;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<signed_char>_>_> __comp;
  ulong uVar3;
  idx_t iVar4;
  undefined7 uStack_17;
  
  iVar4 = this->FRN;
  iVar1 = this->end;
  uVar3 = iVar1 - this->begin;
  if (iVar4 != iVar1 && uVar3 != 0) {
    lVar2 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    __comp._M_comp._17_7_ = uStack_17;
    __comp._M_comp.desc = this->desc;
    __comp._M_comp.accessor_r = accessor;
    __comp._M_comp.accessor_l = accessor;
    ::std::
    __introselect<signed_char*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<signed_char>>>>
              (v_t + this->begin,v_t + iVar4,v_t + iVar1,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
               __comp);
    iVar4 = this->FRN;
  }
  return v_t[iVar4];
}

Assistant:

typename ACCESSOR::RESULT_TYPE InterpolateInternal(INPUT_TYPE *v_t, const ACCESSOR &accessor = ACCESSOR()) const {
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
		return accessor(v_t[FRN]);
	}